

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_common.c
# Opt level: O1

void av1_qm_init(CommonQuantParams *quant_params,int num_planes)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  int *piVar5;
  uint uVar6;
  qm_val_t *(*paapqVar7) [3] [19];
  qm_val_t *(*paapqVar8) [3] [19];
  int t;
  long lVar9;
  int q;
  long lVar10;
  qm_val_t *(*local_48) [3] [19];
  
  lVar10 = 0;
  local_48 = quant_params->giqmatrix;
  do {
    if (0 < num_planes) {
      uVar3 = 0;
      paapqVar7 = quant_params->giqmatrix + 0xf;
      paapqVar8 = local_48;
      do {
        lVar9 = 0;
        piVar5 = tx_size_2d;
        iVar4 = 0;
        do {
          uVar6 = (uint)lVar9 & 0xff;
          if (uVar6 < 0x11) {
            lVar2 = 3;
            if ((1 < uVar6 - 0xb) && (uVar6 != 4)) {
LAB_00398f70:
              lVar2 = lVar9;
            }
          }
          else if (uVar6 == 0x11) {
            lVar2 = 9;
          }
          else {
            if (uVar6 != 0x12) goto LAB_00398f70;
            lVar2 = 10;
          }
          if (lVar10 == 0xf) {
            paapqVar7[0x10][0][lVar9] = (qm_val_t *)0x0;
            (*paapqVar7)[0][lVar9] = (qm_val_t *)0x0;
          }
          else if (lVar9 == lVar2) {
            iVar1 = *piVar5;
            paapqVar8[0x10][0][lVar9] = wt_matrix_ref[lVar10][uVar3 != 0] + iVar4;
            (*paapqVar8)[0][lVar9] = iwt_matrix_ref[lVar10][uVar3 != 0] + iVar4;
            iVar4 = iVar4 + iVar1;
          }
          else {
            paapqVar8[0x10][0][lVar9] = quant_params->gqmatrix[lVar10][uVar3][lVar2];
            (*paapqVar8)[0][lVar9] = quant_params->giqmatrix[lVar10][uVar3][lVar2];
          }
          lVar9 = lVar9 + 1;
          piVar5 = piVar5 + 1;
        } while (lVar9 != 0x13);
        uVar3 = uVar3 + 1;
        paapqVar8 = (qm_val_t *(*) [3] [19])(*paapqVar8 + 1);
        paapqVar7 = (qm_val_t *(*) [3] [19])(*paapqVar7 + 1);
      } while (uVar3 != (uint)num_planes);
    }
    lVar10 = lVar10 + 1;
    local_48 = local_48 + 1;
    if (lVar10 == 0x10) {
      return;
    }
  } while( true );
}

Assistant:

void av1_qm_init(CommonQuantParams *quant_params, int num_planes) {
#if CONFIG_QUANT_MATRIX || CONFIG_AV1_DECODER
  for (int q = 0; q < NUM_QM_LEVELS; ++q) {
    for (int c = 0; c < num_planes; ++c) {
      int current = 0;
      for (int t = 0; t < TX_SIZES_ALL; ++t) {
        const int size = tx_size_2d[t];
        const int qm_tx_size = av1_get_adjusted_tx_size(t);
        if (q == NUM_QM_LEVELS - 1) {
          quant_params->gqmatrix[q][c][t] = NULL;
          quant_params->giqmatrix[q][c][t] = NULL;
        } else if (t != qm_tx_size) {  // Reuse matrices for 'qm_tx_size'
          assert(t > qm_tx_size);
          quant_params->gqmatrix[q][c][t] =
              quant_params->gqmatrix[q][c][qm_tx_size];
          quant_params->giqmatrix[q][c][t] =
              quant_params->giqmatrix[q][c][qm_tx_size];
        } else {
          assert(current + size <= QM_TOTAL_SIZE);
          quant_params->gqmatrix[q][c][t] = &wt_matrix_ref[q][c >= 1][current];
          quant_params->giqmatrix[q][c][t] =
              &iwt_matrix_ref[q][c >= 1][current];
          current += size;
        }
      }
    }
  }
#else
  (void)quant_params;
  (void)num_planes;
#endif  // CONFIG_QUANT_MATRIX || CONFIG_AV1_DECODER
}